

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall
CVmObjDict::add_word
          (CVmObjDict *this,vm_obj_id_t self,char *str,size_t len,vm_obj_id_t obj,
          vm_prop_id_t voc_prop)

{
  char *pcVar1;
  int iVar2;
  dict_undo_rec *rec;
  CVmObjDict *this_00;
  
  this_00 = this;
  iVar2 = add_hash_entry(this,str,len,1,obj,voc_prop,0);
  if ((iVar2 != 0) && (G_undo_X != (CVmUndo *)0x0)) {
    rec = alloc_undo_rec(this_00,DICT_UNDO_ADD,str,len);
    rec->obj = obj;
    rec->prop = voc_prop;
    add_undo_rec(this_00,self,rec);
  }
  pcVar1 = (this->super_CVmObject).ext_;
  pcVar1[0x18] = '\x01';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  return;
}

Assistant:

void CVmObjDict::add_word(VMG_ vm_obj_id_t self,
                          const char *str, size_t len,
                          vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    /* add the entry */
    int added = add_hash_entry(vmg_ str, len, TRUE, obj, voc_prop, FALSE);

    /* 
     *   if there's a global undo object, and we actually added a new
     *   entry, add undo for the change 
     */
    if (added && G_undo != 0)
    {
        dict_undo_rec *undo_rec;

        /* create the undo record */
        undo_rec = alloc_undo_rec(DICT_UNDO_ADD, str, len);
        undo_rec->obj = obj;
        undo_rec->prop = voc_prop;

        /* add the undo record */
        add_undo_rec(vmg_ self, undo_rec);
    }

    /* mark the object as modified since load */
    get_ext()->modified_ = TRUE;
}